

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_dot(runtime_type *this,var *a,token_base *b)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  types tVar2;
  constant_values *pcVar3;
  callable *this_00;
  undefined8 uVar4;
  token_id *in_RCX;
  proxy *in_RDI;
  string *str;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *cmap;
  vector args;
  callable *func;
  var *val_1;
  var *val;
  var_id *in_stack_fffffffffffffd68;
  domain_manager *in_stack_fffffffffffffd70;
  domain_manager *in_stack_fffffffffffffd78;
  type_info *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  any *in_stack_fffffffffffffd90;
  allocator_type *in_stack_fffffffffffffd98;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffda0;
  iterator in_stack_fffffffffffffda8;
  any *in_stack_fffffffffffffdb0;
  var_id *in_stack_fffffffffffffdb8;
  type_t *in_stack_fffffffffffffdc0;
  any *in_stack_fffffffffffffdf0;
  undefined1 ***local_1f8;
  any *in_stack_fffffffffffffe20;
  var_id *in_stack_fffffffffffffe28;
  structure *in_stack_fffffffffffffe30;
  allocator local_d1;
  string local_d0 [40];
  undefined8 **local_a8;
  undefined1 **local_a0;
  undefined8 **local_98;
  undefined8 local_90;
  callable *local_70;
  var *local_68;
  var *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  token_id *local_20;
  
  local_20 = in_RCX;
  cs_impl::any::type((any *)in_stack_fffffffffffffd70);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffd80,(type_info *)in_stack_fffffffffffffd78);
  if (bVar1) {
    pcVar3 = cs_impl::any::const_val<cs::constant_values>(in_stack_fffffffffffffdf0);
    if (*pcVar3 == local_namepace) {
      token_id::get_id(local_20);
      domain_manager::get_var_current<cs::var_id_const&>
                (in_stack_fffffffffffffd78,(var_id *)in_stack_fffffffffffffd70);
      cs_impl::any::any((any *)in_stack_fffffffffffffd70,(any *)in_stack_fffffffffffffd68);
    }
    else {
      if (*pcVar3 != global_namespace) {
        local_55 = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"Unknown scope tag.",&local_41);
        runtime_error::runtime_error
                  ((runtime_error *)in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68);
        local_55 = 0;
        __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      token_id::get_id(local_20);
      domain_manager::get_var_global<cs::var_id_const&>
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      cs_impl::any::any((any *)in_stack_fffffffffffffd70,(any *)in_stack_fffffffffffffd68);
    }
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffd70);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffd80,(type_info *)in_stack_fffffffffffffd78);
    if (bVar1) {
      cs_impl::any::val<std::shared_ptr<cs::name_space>>(in_stack_fffffffffffffe20);
      std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x516e1c);
      token_id::get_id(local_20);
      name_space::get_var((name_space *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      cs_impl::any::any((any *)in_stack_fffffffffffffd70,(any *)in_stack_fffffffffffffd68);
    }
    else {
      cs_impl::any::type((any *)in_stack_fffffffffffffd70);
      bVar1 = std::type_info::operator==
                        (in_stack_fffffffffffffd80,(type_info *)in_stack_fffffffffffffd78);
      if (bVar1) {
        cs_impl::any::const_val<cs::type_t>(in_stack_fffffffffffffdf0);
        token_id::get_id(local_20);
        type_t::get_var<cs::var_id_const&>(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        cs_impl::any::any((any *)in_stack_fffffffffffffd70,(any *)in_stack_fffffffffffffd68);
      }
      else {
        cs_impl::any::type((any *)in_stack_fffffffffffffd70);
        bVar1 = std::type_info::operator==
                          (in_stack_fffffffffffffd80,(type_info *)in_stack_fffffffffffffd78);
        if (bVar1) {
          cs_impl::any::val<cs::structure>(in_stack_fffffffffffffe20);
          token_id::get_id(local_20);
          local_60 = structure::get_var<cs::var_id_const&>
                               (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          cs_impl::any::type((any *)in_stack_fffffffffffffd70);
          bVar1 = std::type_info::operator==
                            (in_stack_fffffffffffffd80,(type_info *)in_stack_fffffffffffffd78);
          if (bVar1) {
            this_00 = cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffdf0);
            bVar1 = callable::is_member_fn(this_00);
            if (bVar1) {
              cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&>
                        ((any *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                         (any *)in_stack_fffffffffffffd80);
              return (var)in_RDI;
            }
          }
          cs_impl::any::any((any *)in_stack_fffffffffffffd70,(any *)in_stack_fffffffffffffd68);
        }
        else {
          cs_impl::any::get_ext(in_stack_fffffffffffffdb0);
          std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x516fbb);
          token_id::get_id(local_20);
          local_68 = name_space::get_var((name_space *)in_stack_fffffffffffffd70,
                                         in_stack_fffffffffffffd68);
          cs_impl::any::type((any *)in_stack_fffffffffffffd70);
          bVar1 = std::type_info::operator==
                            (in_stack_fffffffffffffd80,(type_info *)in_stack_fffffffffffffd78);
          if (bVar1) {
            local_70 = cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffdf0);
            tVar2 = callable::type(local_70);
            if (tVar2 == member_visitor) {
              local_a8 = &local_a0;
              cs_impl::any::any((any *)in_stack_fffffffffffffd70,(any *)in_stack_fffffffffffffd68);
              local_98 = &local_a0;
              local_90 = 1;
              std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x5170f7);
              __l._M_len = (size_type)in_stack_fffffffffffffdb0;
              __l._M_array = in_stack_fffffffffffffda8;
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                        (in_stack_fffffffffffffda0,__l,in_stack_fffffffffffffd98);
              std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x51712b);
              local_1f8 = (undefined1 ***)&local_98;
              do {
                local_1f8 = local_1f8 + -1;
                cs_impl::any::~any((any *)0x517160);
              } while (local_1f8 != &local_a0);
              callable::call((callable *)in_stack_fffffffffffffd78,
                             (vector *)in_stack_fffffffffffffd70);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                        ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                         in_stack_fffffffffffffd80);
            }
            else {
              if (tVar2 == force_regular) {
                uVar4 = __cxa_allocate_exception(0x28);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_d0,"Cannot call regular function as member function.",&local_d1);
                runtime_error::runtime_error
                          ((runtime_error *)in_stack_fffffffffffffd70,
                           (string *)in_stack_fffffffffffffd68);
                __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
              }
              bVar1 = callable::is_request_fold(local_70);
              cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&,bool>
                        ((any *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                         (bool *)CONCAT17(bVar1,in_stack_fffffffffffffd88));
            }
          }
          else {
            cs_impl::any::any((any *)in_stack_fffffffffffffd70,(any *)in_stack_fffffffffffffd68);
          }
        }
      }
    }
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_dot(const var &a, token_base *b)
	{
		if (a.type() == typeid(constant_values)) {
			switch (a.const_val<constant_values>()) {
			case constant_values::global_namespace:
				return storage.get_var_global(static_cast<token_id *>(b)->get_id());
			case constant_values::local_namepace:
				return storage.get_var_current(static_cast<token_id *>(b)->get_id());
			default:
				throw runtime_error("Unknown scope tag.");
			}
		}
		else if (a.type() == typeid(namespace_t))
			return a.val<namespace_t>()->get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(type_t))
			return a.const_val<type_t>().get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(structure)) {
			var &val = a.val<structure>().get_var(static_cast<token_id *>(b)->get_id());
			if (val.type() == typeid(callable) && val.const_val<callable>().is_member_fn())
				return var::make_protect<object_method>(a, val);
			else
				return val;
		}
		else {
			try {
				var &val = a.get_ext()->get_var(static_cast<token_id *>(b)->get_id());
				if (val.type() == typeid(callable)) {
					const callable &func = val.const_val<callable>();
					switch (func.type()) {
					case callable::types::member_visitor: {
						vector args{a};
						return func.call(args);
					}
					case callable::types::force_regular:
						throw runtime_error("Cannot call regular function as member function.");
					default:
						return var::make_protect<object_method>(a, val, func.is_request_fold());
					}
				}
				else
					return val;
			}
			catch (...) {
				if (a.type() == typeid(hash_map)) {
					const auto &cmap = a.const_val<hash_map>();
					const string &str = static_cast<token_id *>(b)->get_id().get_id();
					if (cmap.count(str) == 0)
						throw runtime_error(std::string("Key \"") + str + "\" does not exist.");
					return cmap.at(str);
				}
				else
					throw;
			}
		}
	}